

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall CppGenerator::computeViewLevel(CppGenerator *this,size_t group_id,TDNode *node)

{
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *this_00;
  ulong *puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pvVar4;
  size_t *psVar5;
  Aggregate *pAVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  size_t *psVar13;
  pointer pbVar14;
  bool bVar15;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar16;
  pointer pbVar17;
  size_t sVar18;
  View *pVVar19;
  ulong uVar20;
  pointer pbVar21;
  Function *pFVar22;
  _WordT *p_Var23;
  Function *pFVar24;
  pointer pbVar25;
  size_t sVar26;
  ulong uVar27;
  pointer ppAVar28;
  ulong *puVar29;
  ulong uVar30;
  pointer ppAVar31;
  size_t *psVar32;
  size_t f2;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  size_t *incViewID;
  ulong uVar39;
  ulong uVar40;
  size_t *psVar41;
  ulong __position;
  bool bVar42;
  var_bitset coveredVariableOrder;
  prod_bitset overlapFunc;
  ulong local_268;
  ulong local_260;
  ulong local_248;
  ulong local_230;
  ulong local_228;
  ulong local_1b8 [25];
  ulong local_f0 [24];
  
  pvVar16 = this->groupVariableOrder + group_id;
  this_00 = &this->coveredVariables;
  pbVar17 = (this->coveredVariables).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->coveredVariables).
      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pbVar17) {
    (this->coveredVariables).
    super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar17;
  }
  pbVar17 = (this->groupVariableOrderBitset).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_start + group_id;
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            (this_00,(long)(pvVar16->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar16->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start >> 3);
  puVar2 = (this->addableViews).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->addableViews).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    memset(puVar2,0,(long)puVar3 - (long)puVar2 & 0xfffffffffffffff8);
  }
  puVar2 = (pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sVar18 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->addableViews,(sVar18 + 1) * ((long)puVar2 - (long)puVar3 >> 3),false);
  pvVar4 = (this->viewGroups).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar32 = pvVar4[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  psVar5 = *(pointer *)
            ((long)&pvVar4[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  do {
    if (psVar32 == psVar5) {
      return;
    }
    pVVar19 = QueryCompiler::getView
                        ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,*psVar32);
    local_228 = (pVVar19->_fVars).super__Base_bitset<2UL>._M_w[0];
    local_230 = (pVVar19->_fVars).super__Base_bitset<2UL>._M_w[1];
    bVar42 = local_230 == 0 && local_228 == 0;
    if (local_230 == 0 && local_228 == 0) {
      this->viewLevelRegister[*psVar32] =
           (long)(pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      local_228 = (pVVar19->_fVars).super__Base_bitset<2UL>._M_w[0];
      local_230 = (pVVar19->_fVars).super__Base_bitset<2UL>._M_w[1];
    }
    p_Var23 = (((this->variableDependency).
                super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl
                .super__Vector_impl_data._M_start)->super__Base_bitset<2UL>)._M_w + 1;
    uVar30 = 0;
    uVar39 = 0;
    uVar20 = 0;
    do {
      if (((pVVar19->_fVars).super__Base_bitset<2UL>._M_w[uVar30 >> 6] >> (uVar30 & 0x3f) & 1) != 0)
      {
        uVar39 = uVar39 | ((_Base_bitset<2UL> *)(p_Var23 + -1))->_M_w[0];
        uVar20 = uVar20 | *p_Var23;
      }
      uVar30 = uVar30 + 1;
      p_Var23 = p_Var23 + 2;
    } while (uVar30 != 100);
    uVar30 = (pbVar17->super__Base_bitset<2UL>)._M_w[0];
    uVar37 = ~(pbVar17->super__Base_bitset<2UL>)._M_w[1] & 0xfffffffff;
    if ((~(node->_bag).super__Base_bitset<2UL>._M_w[1] & local_230 & uVar37) != 0 ||
        (~((node->_bag).super__Base_bitset<2UL>._M_w[0] | uVar30) & local_228) != 0) {
      ppAVar28 = (pVVar19->_aggregates).
                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar31 = (pVVar19->_aggregates).
                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (ppAVar31 != ppAVar28) {
        uVar35 = 0;
        do {
          pAVar6 = ppAVar28[uVar35];
          pbVar21 = (pAVar6->_agg).
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((pAVar6->_agg).
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl
              .super__Vector_impl_data._M_finish != pbVar21) {
            uVar34 = 0;
            do {
              memset(local_1b8,0,0xc0);
              __position = 0;
              do {
                bVar15 = std::bitset<1500UL>::test(pbVar21 + uVar34,__position);
                if (bVar15) {
                  if ((local_1b8[__position >> 6] >> (__position & 0x3f) & 1) == 0) {
                    pFVar22 = QueryCompiler::getFunction
                                        ((this->_qc).
                                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,__position);
                    local_248 = (pFVar22->_fVars).super__Base_bitset<2UL>._M_w[0];
                    local_260 = (pFVar22->_fVars).super__Base_bitset<2UL>._M_w[1];
                    if ((uVar37 & uVar20 & local_260) != 0 || (uVar39 & ~uVar30 & local_248) != 0) {
                      p_Var23 = (((this->variableDependency).
                                  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Base_bitset<2UL>)._M_w + 1;
                      uVar27 = 0;
                      local_268 = 0;
                      uVar36 = 0;
                      do {
                        if (((pFVar22->_fVars).super__Base_bitset<2UL>._M_w[uVar27 >> 6] >>
                             (uVar27 & 0x3f) & 1) != 0) {
                          local_268 = local_268 | ((_Base_bitset<2UL> *)(p_Var23 + -1))->_M_w[0];
                          uVar36 = uVar36 | *p_Var23;
                        }
                        uVar27 = uVar27 + 1;
                        p_Var23 = p_Var23 + 2;
                      } while (uVar27 != 100);
                      uVar27 = (pbVar17->super__Base_bitset<2UL>)._M_w[0];
                      uVar7 = (pbVar17->super__Base_bitset<2UL>)._M_w[1];
                      memset(local_f0,0,0xc0);
                      local_f0[__position >> 6] =
                           local_f0[__position >> 6] | 1L << ((byte)__position & 0x3f);
                      do {
                        local_248 = local_248 | (pFVar22->_fVars).super__Base_bitset<2UL>._M_w[0];
                        local_260 = local_260 | (pFVar22->_fVars).super__Base_bitset<2UL>._M_w[1];
                        uVar33 = 0;
                        bVar15 = false;
                        do {
                          uVar38 = uVar33 >> 6;
                          uVar40 = 1L << ((byte)uVar33 & 0x3f);
                          if ((((pbVar21[uVar34].super__Base_bitset<24UL>._M_w[uVar38] >>
                                 (uVar33 & 0x3f) & 1) != 0) &&
                              (uVar8 = local_1b8[uVar38], (uVar8 & uVar40) == 0)) &&
                             (uVar9 = local_f0[uVar38], (uVar9 & uVar40) == 0)) {
                            pFVar24 = QueryCompiler::getFunction
                                                ((this->_qc).
                                                 super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr,__position);
                            uVar10 = (pFVar24->_fVars).super__Base_bitset<2UL>._M_w[0];
                            uVar11 = (pFVar24->_fVars).super__Base_bitset<2UL>._M_w[1];
                            if ((uVar11 & uVar36 & 0xfffffffff & ~uVar7) != 0 ||
                                (uVar10 & local_268 & ~uVar27) != 0) {
                              local_1b8[uVar38] = uVar8 | uVar40;
                              local_f0[uVar38] = uVar9 | uVar40;
                              local_248 = local_248 | uVar10;
                              local_260 = local_260 | uVar11;
                              bVar15 = true;
                            }
                          }
                          uVar33 = uVar33 + 1;
                        } while (uVar33 != 0x5dc);
                      } while (bVar15);
                      local_228 = local_228 | local_248;
                      local_230 = local_230 | local_260;
                    }
                  }
                }
                __position = __position + 1;
              } while (__position != 0x5dc);
              uVar34 = uVar34 + 1;
              pbVar21 = (pAVar6->_agg).
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar34 < (ulong)(((long)(pAVar6->_agg).
                                             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pbVar21 >> 6) * -0x5555555555555555));
            ppAVar28 = (pVVar19->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            ppAVar31 = (pVVar19->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 < (ulong)((long)ppAVar31 - (long)ppAVar28 >> 3));
      }
    }
    local_1b8[0] = 0;
    local_1b8[1] = 0;
    puVar29 = (pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar12 = (pvVar16->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (puVar29 != puVar12) {
      local_268 = 0;
      do {
        uVar20 = *puVar29;
        if (99 < uVar20) {
          std::__throw_out_of_range_fmt
                    ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar20,100)
          ;
        }
        uVar37 = 1L << ((byte)uVar20 & 0x3f);
        local_1b8[uVar20 >> 6] = local_1b8[uVar20 >> 6] | uVar37;
        uVar39 = local_1b8[1];
        uVar30 = local_1b8[0];
        pbVar25 = (this_00->
                  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>).
                  _M_impl.super__Vector_impl_data._M_start + local_268;
        p_Var23 = (pbVar25->super__Base_bitset<2UL>)._M_w + (uVar20 >> 6);
        *p_Var23 = *p_Var23 | uVar37;
        uVar20 = (node->_bag).super__Base_bitset<2UL>._M_w[0];
        if (((pbVar17->super__Base_bitset<2UL>)._M_w[0] & uVar20 & ~local_1b8[0]) == 0 &&
            (~local_1b8[1] &
            (pbVar17->super__Base_bitset<2UL>)._M_w[1] &
            (node->_bag).super__Base_bitset<2UL>._M_w[1]) == 0) {
          (pbVar25->super__Base_bitset<2UL>)._M_w[0] =
               (pbVar25->super__Base_bitset<2UL>)._M_w[0] | uVar20;
          p_Var23 = (pbVar25->super__Base_bitset<2UL>)._M_w + 1;
          *p_Var23 = *p_Var23 | (node->_bag).super__Base_bitset<2UL>._M_w[1];
        }
        psVar13 = this->incomingViews[*psVar32].
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (psVar41 = this->incomingViews[*psVar32].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; psVar41 != psVar13; psVar41 = psVar41 + 1)
        {
          pVVar19 = QueryCompiler::getView
                              ((this->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               *psVar41);
          uVar37 = (pbVar17->super__Base_bitset<2UL>)._M_w[1] &
                   (pVVar19->_fVars).super__Base_bitset<2UL>._M_w[1];
          uVar20 = (pbVar17->super__Base_bitset<2UL>)._M_w[0] &
                   (pVVar19->_fVars).super__Base_bitset<2UL>._M_w[0];
          if ((uVar37 & uVar39) == uVar37 && (uVar20 & uVar30) == uVar20) {
            sVar18 = *psVar41;
            sVar26 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            uVar20 = (sVar26 + 1) * local_268 + sVar18;
            puVar1 = (this->addableViews).m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start + (uVar20 >> 6);
            *puVar1 = *puVar1 | 1L << ((byte)uVar20 & 0x3f);
            pbVar14 = (this->coveredVariables).
                      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pbVar25 = pbVar14 + local_268;
            (pbVar25->super__Base_bitset<2UL>)._M_w[0] =
                 (pbVar25->super__Base_bitset<2UL>)._M_w[0] |
                 (pVVar19->_fVars).super__Base_bitset<2UL>._M_w[0];
            p_Var23 = pbVar14[local_268].super__Base_bitset<2UL>._M_w + 1;
            *p_Var23 = *p_Var23 | (pVVar19->_fVars).super__Base_bitset<2UL>._M_w[1];
          }
        }
        bVar15 = !bVar42;
        bVar42 = true;
        if (bVar15) {
          pbVar25 = (this_00->
                    super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if ((~pbVar25[local_268].super__Base_bitset<2UL>._M_w[0] & local_228) == 0 &&
              (~pbVar25[local_268].super__Base_bitset<2UL>._M_w[1] & local_230) == 0) {
            this->viewLevelRegister[*psVar32] = local_268;
          }
          else {
            bVar42 = false;
          }
        }
        local_268 = local_268 + 1;
        puVar29 = puVar29 + 1;
      } while (puVar29 != puVar12);
    }
    psVar32 = psVar32 + 1;
  } while( true );
}

Assistant:

void CppGenerator::computeViewLevel(size_t group_id, const TDNode& node)
{
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];

    coveredVariables.clear();
    coveredVariables.resize(varOrder.size());
    
    addableViews.reset();
    addableViews.resize(varOrder.size() * (_qc->numberOfViews()+1));

    for (const size_t& viewID : viewGroups[group_id])
    {
        View* view = _qc->getView(viewID);
        bool setViewLevel = false;
        
        // if this view has no free variables it should be outputted before the join 
        if (view->_fVars.none())
        {
            viewLevelRegister[viewID] = varOrder.size();
            setViewLevel = true;
        }
        
        var_bitset varsToCover = view->_fVars;

        var_bitset dependentViewVars;
        for (size_t var=0; var<NUM_OF_VARIABLES;++var)
        {
            if (view->_fVars[var])
                dependentViewVars |= variableDependency[var];
        }
        dependentViewVars &= ~varOrderBitset;

        // TODO: (consider) should we check for overlap for bag vars that are
        // not in varOrder?
        var_bitset nonJoinVars = view->_fVars & ~varOrderBitset & ~node._bag;
        
        if (nonJoinVars.any())
        {
            //  if this is the case then look for overlapping functions
            for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
            {
                Aggregate* aggregate = view->_aggregates[aggNo];

                for (size_t i = 0; i < aggregate->_agg.size(); ++i)
                {
                    const prod_bitset& product = aggregate->_agg[i];
                    prod_bitset considered;
                        
                    for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                    {
                        if (product.test(f) && !considered[f])
                        {
                            Function* function = _qc->getFunction(f);
                                
                            // check if this function is covered
                            if ((function->_fVars & dependentViewVars).any())
                            {
                                var_bitset dependentFunctionVars;
                                for (size_t var=0; var<NUM_OF_VARIABLES;++var)
                                {
                                    if (function->_fVars[var])
                                        dependentFunctionVars |= variableDependency[var];
                                }
                                dependentFunctionVars &= ~varOrderBitset;

                                // if it is - find functions that overlap
                                bool overlaps;
                                var_bitset overlapVars = function->_fVars;
                                prod_bitset overlapFunc;
                                overlapFunc.set(f);

                                do
                                {
                                    overlaps = false;
                                    overlapVars |= function->_fVars;

                                    for (size_t f2 = 0; f2 < NUM_OF_FUNCTIONS; ++f2)
                                    {
                                        if (product[f2] && !considered[f2] && !overlapFunc[f2])
                                        {
                                            Function* otherFunction = _qc->getFunction(f);
                                            // check if functions overlap
                                            if ((otherFunction->_fVars & dependentFunctionVars).any())
                                            {
                                                considered.set(f2);
                                                overlapFunc.set(f2);
                                                overlaps = true;
                                                overlapVars |= otherFunction->_fVars;
                                            }
                                        }
                                    }
                                } while(overlaps);

                                varsToCover |= overlapVars;
                            }
                        }
                    }                        
                }    
            }
        }
        
        // check when the freeVars of the view are covered - this determines
        // when we need to add the declaration of aggregate array and push to
        // view vector !
        size_t depth = 0;
        var_bitset coveredVariableOrder;
 
        for (const size_t& var : varOrder)
        {
            coveredVariableOrder.set(var);
            coveredVariables[depth].set(var);
            
            var_bitset intersection = node._bag & varOrderBitset;
            if ((intersection & coveredVariableOrder) == intersection) 
                coveredVariables[depth] |= node._bag;

            for (const size_t& incViewID : incomingViews[viewID]) 
            {
                // check if view is covered !
                View* incView = _qc->getView(incViewID);
                
                var_bitset viewJoinVars = incView->_fVars & varOrderBitset;
                if ((viewJoinVars & coveredVariableOrder) == viewJoinVars) 
                {
                    addableViews.set(incViewID + (depth * (_qc->numberOfViews()+1)));
                    coveredVariables[depth] |= incView->_fVars;
                }
            }

            if (!setViewLevel && (varsToCover & coveredVariables[depth]) == varsToCover)
            {
                // this is the depth where we add the declaration of aggregate
                // array and push to the vector !
                viewLevelRegister[viewID] = depth;
                setViewLevel = true;
            }
            ++depth;
        }
    }
}